

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall
print_fileinfo::print_fileinfo(print_fileinfo *this,string *filesystemname,string *romname)

{
  pointer pcVar1;
  
  (this->super_action)._vptr_action = (_func_int **)&PTR__print_fileinfo_00147850;
  (this->_fsname)._M_dataplus._M_p = (pointer)&(this->_fsname).field_2;
  pcVar1 = (filesystemname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_fsname,pcVar1,pcVar1 + filesystemname->_M_string_length);
  (this->_romname)._M_dataplus._M_p = (pointer)&(this->_romname).field_2;
  pcVar1 = (romname->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_romname,pcVar1,pcVar1 + romname->_M_string_length);
  return;
}

Assistant:

print_fileinfo(const std::string& filesystemname, const std::string&romname)
        : _fsname(filesystemname), _romname(romname)
    {
    }